

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::Unary::finalize(Unary *this)

{
  bool bVar1;
  Type local_80;
  Type local_78;
  Type local_70;
  Type local_68;
  Type local_60;
  Type local_58;
  Type local_50;
  Type local_48;
  Type local_40;
  Type local_38;
  Type local_30;
  Type local_28;
  Type local_20;
  BasicType local_14;
  Unary *local_10;
  Unary *this_local;
  
  local_14 = unreachable;
  local_10 = this;
  bVar1 = wasm::Type::operator==(&this->value->type,&local_14);
  if (bVar1) {
    wasm::Type::Type(&local_20,unreachable);
    (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
         local_20.id;
  }
  else {
    switch(this->op) {
    case ClzInt32:
    case ClzInt64:
    case CtzInt32:
    case CtzInt64:
    case PopcntInt32:
    case PopcntInt64:
    case NegFloat32:
    case NegFloat64:
    case AbsFloat32:
    case AbsFloat64:
    case CeilFloat32:
    case CeilFloat64:
    case FloorFloat32:
    case FloorFloat64:
    case TruncFloat32:
    case TruncFloat64:
    case NearestFloat32:
    case NearestFloat64:
    case SqrtFloat32:
    case SqrtFloat64:
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           (this->value->type).id;
      break;
    case EqZInt32:
    case EqZInt64:
      wasm::Type::Type(&local_28,i32);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           local_28.id;
      break;
    case ExtendSInt32:
    case ExtendUInt32:
    case ExtendS8Int64:
    case ExtendS16Int64:
    case ExtendS32Int64:
      wasm::Type::Type(&local_38,i64);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           local_38.id;
      break;
    case WrapInt64:
      wasm::Type::Type(&local_40,i32);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           local_40.id;
      break;
    case TruncSFloat32ToInt32:
    case TruncUFloat32ToInt32:
    case TruncSFloat64ToInt32:
    case TruncUFloat64ToInt32:
    case ReinterpretFloat32:
    case TruncSatSFloat32ToInt32:
    case TruncSatUFloat32ToInt32:
    case TruncSatSFloat64ToInt32:
    case TruncSatUFloat64ToInt32:
      wasm::Type::Type(&local_58,i32);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           local_58.id;
      break;
    case TruncSFloat32ToInt64:
    case TruncUFloat32ToInt64:
    case TruncSFloat64ToInt64:
    case TruncUFloat64ToInt64:
    case ReinterpretFloat64:
    case TruncSatSFloat32ToInt64:
    case TruncSatUFloat32ToInt64:
    case TruncSatSFloat64ToInt64:
    case TruncSatUFloat64ToInt64:
      wasm::Type::Type(&local_60,i64);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           local_60.id;
      break;
    case ConvertSInt32ToFloat32:
    case ConvertUInt32ToFloat32:
    case ConvertSInt64ToFloat32:
    case ConvertUInt64ToFloat32:
    case ReinterpretInt32:
      wasm::Type::Type(&local_68,f32);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           local_68.id;
      break;
    case ConvertSInt32ToFloat64:
    case ConvertUInt32ToFloat64:
    case ConvertSInt64ToFloat64:
    case ConvertUInt64ToFloat64:
    case ReinterpretInt64:
      wasm::Type::Type(&local_70,f64);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           local_70.id;
      break;
    case PromoteFloat32:
      wasm::Type::Type(&local_48,f64);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           local_48.id;
      break;
    case DemoteFloat64:
      wasm::Type::Type(&local_50,f32);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           local_50.id;
      break;
    case ExtendS8Int32:
    case ExtendS16Int32:
      wasm::Type::Type(&local_30,i32);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           local_30.id;
      break;
    case SplatVecI8x16:
    case SplatVecI16x8:
    case SplatVecI32x4:
    case SplatVecI64x2:
    case SplatVecF32x4:
    case SplatVecF64x2:
    case NotVec128:
    case AbsVecI8x16:
    case NegVecI8x16:
    case PopcntVecI8x16:
    case AbsVecI16x8:
    case NegVecI16x8:
    case AbsVecI32x4:
    case NegVecI32x4:
    case AbsVecI64x2:
    case NegVecI64x2:
    case AbsVecF32x4:
    case NegVecF32x4:
    case SqrtVecF32x4:
    case CeilVecF32x4:
    case FloorVecF32x4:
    case TruncVecF32x4:
    case NearestVecF32x4:
    case AbsVecF64x2:
    case NegVecF64x2:
    case SqrtVecF64x2:
    case CeilVecF64x2:
    case FloorVecF64x2:
    case TruncVecF64x2:
    case NearestVecF64x2:
    case ExtAddPairwiseSVecI8x16ToI16x8:
    case ExtAddPairwiseUVecI8x16ToI16x8:
    case ExtAddPairwiseSVecI16x8ToI32x4:
    case ExtAddPairwiseUVecI16x8ToI32x4:
    case TruncSatSVecF32x4ToVecI32x4:
    case TruncSatUVecF32x4ToVecI32x4:
    case ConvertSVecI32x4ToVecF32x4:
    case ConvertUVecI32x4ToVecF32x4:
    case ExtendLowSVecI8x16ToVecI16x8:
    case ExtendHighSVecI8x16ToVecI16x8:
    case ExtendLowUVecI8x16ToVecI16x8:
    case ExtendHighUVecI8x16ToVecI16x8:
    case ExtendLowSVecI16x8ToVecI32x4:
    case ExtendHighSVecI16x8ToVecI32x4:
    case ExtendLowUVecI16x8ToVecI32x4:
    case ExtendHighUVecI16x8ToVecI32x4:
    case ExtendLowSVecI32x4ToVecI64x2:
    case ExtendHighSVecI32x4ToVecI64x2:
    case ExtendLowUVecI32x4ToVecI64x2:
    case ExtendHighUVecI32x4ToVecI64x2:
    case ConvertLowSVecI32x4ToVecF64x2:
    case ConvertLowUVecI32x4ToVecF64x2:
    case TruncSatZeroSVecF64x2ToVecI32x4:
    case TruncSatZeroUVecF64x2ToVecI32x4:
    case DemoteZeroVecF64x2ToVecF32x4:
    case PromoteLowVecF32x4ToVecF64x2:
    case RelaxedTruncSVecF32x4ToVecI32x4:
    case RelaxedTruncUVecF32x4ToVecI32x4:
    case RelaxedTruncZeroSVecF64x2ToVecI32x4:
    case RelaxedTruncZeroUVecF64x2ToVecI32x4:
      wasm::Type::Type(&local_78,v128);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           local_78.id;
      break;
    case AnyTrueVec128:
    case AllTrueVecI8x16:
    case BitmaskVecI8x16:
    case AllTrueVecI16x8:
    case BitmaskVecI16x8:
    case AllTrueVecI32x4:
    case BitmaskVecI32x4:
    case AllTrueVecI64x2:
    case BitmaskVecI64x2:
      wasm::Type::Type(&local_80,i32);
      (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
           local_80.id;
      break;
    case InvalidUnary:
      handle_unreachable("invalid unary op",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm.cpp"
                         ,0x2c8);
    }
  }
  return;
}

Assistant:

void Unary::finalize() {
  if (value->type == Type::unreachable) {
    type = Type::unreachable;
    return;
  }
  switch (op) {
    case ClzInt32:
    case CtzInt32:
    case PopcntInt32:
    case NegFloat32:
    case AbsFloat32:
    case CeilFloat32:
    case FloorFloat32:
    case TruncFloat32:
    case NearestFloat32:
    case SqrtFloat32:
    case ClzInt64:
    case CtzInt64:
    case PopcntInt64:
    case NegFloat64:
    case AbsFloat64:
    case CeilFloat64:
    case FloorFloat64:
    case TruncFloat64:
    case NearestFloat64:
    case SqrtFloat64:
      type = value->type;
      break;
    case EqZInt32:
    case EqZInt64:
      type = Type::i32;
      break;
    case ExtendS8Int32:
    case ExtendS16Int32:
      type = Type::i32;
      break;
    case ExtendSInt32:
    case ExtendUInt32:
    case ExtendS8Int64:
    case ExtendS16Int64:
    case ExtendS32Int64:
      type = Type::i64;
      break;
    case WrapInt64:
      type = Type::i32;
      break;
    case PromoteFloat32:
      type = Type::f64;
      break;
    case DemoteFloat64:
      type = Type::f32;
      break;
    case TruncSFloat32ToInt32:
    case TruncUFloat32ToInt32:
    case TruncSFloat64ToInt32:
    case TruncUFloat64ToInt32:
    case TruncSatSFloat32ToInt32:
    case TruncSatUFloat32ToInt32:
    case TruncSatSFloat64ToInt32:
    case TruncSatUFloat64ToInt32:
    case ReinterpretFloat32:
      type = Type::i32;
      break;
    case TruncSFloat32ToInt64:
    case TruncUFloat32ToInt64:
    case TruncSFloat64ToInt64:
    case TruncUFloat64ToInt64:
    case TruncSatSFloat32ToInt64:
    case TruncSatUFloat32ToInt64:
    case TruncSatSFloat64ToInt64:
    case TruncSatUFloat64ToInt64:
    case ReinterpretFloat64:
      type = Type::i64;
      break;
    case ReinterpretInt32:
    case ConvertSInt32ToFloat32:
    case ConvertUInt32ToFloat32:
    case ConvertSInt64ToFloat32:
    case ConvertUInt64ToFloat32:
      type = Type::f32;
      break;
    case ReinterpretInt64:
    case ConvertSInt32ToFloat64:
    case ConvertUInt32ToFloat64:
    case ConvertSInt64ToFloat64:
    case ConvertUInt64ToFloat64:
      type = Type::f64;
      break;
    case SplatVecI8x16:
    case SplatVecI16x8:
    case SplatVecI32x4:
    case SplatVecI64x2:
    case SplatVecF32x4:
    case SplatVecF64x2:
    case NotVec128:
    case AbsVecI8x16:
    case AbsVecI16x8:
    case AbsVecI32x4:
    case AbsVecI64x2:
    case PopcntVecI8x16:
    case NegVecI8x16:
    case NegVecI16x8:
    case NegVecI32x4:
    case NegVecI64x2:
    case AbsVecF32x4:
    case NegVecF32x4:
    case SqrtVecF32x4:
    case CeilVecF32x4:
    case FloorVecF32x4:
    case TruncVecF32x4:
    case NearestVecF32x4:
    case AbsVecF64x2:
    case NegVecF64x2:
    case SqrtVecF64x2:
    case CeilVecF64x2:
    case FloorVecF64x2:
    case TruncVecF64x2:
    case NearestVecF64x2:
    case ExtAddPairwiseSVecI8x16ToI16x8:
    case ExtAddPairwiseUVecI8x16ToI16x8:
    case ExtAddPairwiseSVecI16x8ToI32x4:
    case ExtAddPairwiseUVecI16x8ToI32x4:
    case TruncSatSVecF32x4ToVecI32x4:
    case TruncSatUVecF32x4ToVecI32x4:
    case ConvertSVecI32x4ToVecF32x4:
    case ConvertUVecI32x4ToVecF32x4:
    case ExtendLowSVecI8x16ToVecI16x8:
    case ExtendHighSVecI8x16ToVecI16x8:
    case ExtendLowUVecI8x16ToVecI16x8:
    case ExtendHighUVecI8x16ToVecI16x8:
    case ExtendLowSVecI16x8ToVecI32x4:
    case ExtendHighSVecI16x8ToVecI32x4:
    case ExtendLowUVecI16x8ToVecI32x4:
    case ExtendHighUVecI16x8ToVecI32x4:
    case ExtendLowSVecI32x4ToVecI64x2:
    case ExtendHighSVecI32x4ToVecI64x2:
    case ExtendLowUVecI32x4ToVecI64x2:
    case ExtendHighUVecI32x4ToVecI64x2:
    case ConvertLowSVecI32x4ToVecF64x2:
    case ConvertLowUVecI32x4ToVecF64x2:
    case TruncSatZeroSVecF64x2ToVecI32x4:
    case TruncSatZeroUVecF64x2ToVecI32x4:
    case DemoteZeroVecF64x2ToVecF32x4:
    case PromoteLowVecF32x4ToVecF64x2:
    case RelaxedTruncSVecF32x4ToVecI32x4:
    case RelaxedTruncUVecF32x4ToVecI32x4:
    case RelaxedTruncZeroSVecF64x2ToVecI32x4:
    case RelaxedTruncZeroUVecF64x2ToVecI32x4:
      type = Type::v128;
      break;
    case AnyTrueVec128:
    case AllTrueVecI8x16:
    case AllTrueVecI16x8:
    case AllTrueVecI32x4:
    case AllTrueVecI64x2:
    case BitmaskVecI8x16:
    case BitmaskVecI16x8:
    case BitmaskVecI32x4:
    case BitmaskVecI64x2:
      type = Type::i32;
      break;

    case InvalidUnary:
      WASM_UNREACHABLE("invalid unary op");
  }
}